

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_3a;
  bool local_39;
  int delta;
  int typeDelta;
  Value *other_local;
  Value *this_local;
  
  iVar1 = (uint)(*(ushort *)&this->field_0x8 & 0xff) - (uint)(*(ushort *)&other->field_0x8 & 0xff);
  if (iVar1 == 0) {
    switch(this->field_0x8) {
    case 0:
      this_local._7_1_ = false;
      break;
    case 1:
      this_local._7_1_ = (this->value_).int_ < (other->value_).int_;
      break;
    case 2:
      this_local._7_1_ = (this->value_).uint_ < (other->value_).uint_;
      break;
    case 3:
      this_local._7_1_ = (this->value_).real_ < (other->value_).real_;
      break;
    case 4:
      if (((this->value_).int_ != 0) || (local_39 = true, (other->value_).int_ == 0)) {
        local_3a = false;
        if (((other->value_).int_ != 0) && (local_3a = false, (this->value_).int_ != 0)) {
          iVar1 = strcmp((this->value_).string_,(other->value_).string_);
          local_3a = iVar1 < 0;
        }
        local_39 = local_3a;
      }
      this_local._7_1_ = local_39;
      break;
    case 5:
      this_local._7_1_ = ((this->value_).bool_ & 1U) < ((other->value_).bool_ & 1U);
      break;
    case 6:
    case 7:
      sVar2 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar3 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((other->value_).map_);
      if ((int)sVar2 == (int)sVar3) {
        this_local._7_1_ = std::operator<((this->value_).map_,(other->value_).map_);
      }
      else {
        this_local._7_1_ = (int)sVar2 - (int)sVar3 < 0;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x1d9,"bool Json::Value::operator<(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = (bool)((byte)(iVar1 >> 0x1f) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
    return (value_.string_ == 0 && other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) < 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) < 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) < 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}